

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_enc.c
# Opt level: O2

void BackwardRefsSwap(VP8LBackwardRefs *refs1,VP8LBackwardRefs *refs2)

{
  PixOrCopyBlock **ppPVar1;
  PixOrCopyBlock **ppPVar2;
  PixOrCopyBlock *pPVar3;
  PixOrCopyBlock *pPVar4;
  PixOrCopyBlock **ppPVar5;
  PixOrCopyBlock *pPVar6;
  PixOrCopyBlock *pPVar7;
  PixOrCopyBlock *pPVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  VP8LBackwardRefs tmp;
  
  ppPVar1 = refs1->tail;
  ppPVar2 = refs2->tail;
  pPVar3 = refs1->last_block;
  iVar11 = refs1->block_size;
  iVar12 = refs1->error;
  pPVar4 = refs1->refs;
  ppPVar5 = refs1->tail;
  pPVar6 = refs1->free_blocks;
  refs1->last_block = refs2->last_block;
  iVar9 = refs2->block_size;
  iVar10 = refs2->error;
  pPVar7 = refs2->refs;
  pPVar8 = refs2->free_blocks;
  refs1->tail = refs2->tail;
  refs1->free_blocks = pPVar8;
  refs1->block_size = iVar9;
  refs1->error = iVar10;
  refs1->refs = pPVar7;
  refs2->last_block = pPVar3;
  refs2->tail = ppPVar5;
  refs2->free_blocks = pPVar6;
  refs2->block_size = iVar11;
  refs2->error = iVar12;
  refs2->refs = pPVar4;
  if (ppPVar2 == &refs2->refs && ppPVar2 != (PixOrCopyBlock **)0x0) {
    refs1->tail = &refs1->refs;
  }
  if (ppPVar1 == &refs1->refs && ppPVar1 != (PixOrCopyBlock **)0x0) {
    refs2->tail = &refs2->refs;
  }
  return;
}

Assistant:

static void BackwardRefsSwap(VP8LBackwardRefs* const refs1,
                             VP8LBackwardRefs* const refs2) {
  const int point_to_refs1 =
      (refs1->tail != NULL && refs1->tail == &refs1->refs);
  const int point_to_refs2 =
      (refs2->tail != NULL && refs2->tail == &refs2->refs);
  const VP8LBackwardRefs tmp = *refs1;
  *refs1 = *refs2;
  *refs2 = tmp;
  if (point_to_refs2) refs1->tail = &refs1->refs;
  if (point_to_refs1) refs2->tail = &refs2->refs;
}